

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_prime.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint64_t in_stack_00000078;
  int local_4;
  
  iVar1 = is_prime(in_stack_00000078);
  if ((((((iVar1 == 1) || (iVar1 = is_prime(in_stack_00000078), iVar1 == 1)) ||
        (iVar1 = is_prime(in_stack_00000078), iVar1 == 0)) ||
       ((iVar1 = is_prime(in_stack_00000078), iVar1 == 0 ||
        (iVar1 = is_prime(in_stack_00000078), iVar1 == 1)))) ||
      ((iVar1 = is_prime(in_stack_00000078), iVar1 == 0 ||
       ((iVar1 = is_prime(in_stack_00000078), iVar1 == 0 ||
        (iVar1 = is_prime(in_stack_00000078), iVar1 == 1)))))) ||
     ((iVar1 = is_prime(in_stack_00000078), iVar1 == 0 ||
      (iVar1 = is_prime(in_stack_00000078), iVar1 == 0)))) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main() {

    if(is_prime(0) == 1)
        goto error;

    if(is_prime(1) == 1)
        goto error;

    if(is_prime(2) == 0)
        goto error;

    if(is_prime(3) == 0)
        goto error;

    if(is_prime(4) == 1)
        goto error;

    if(is_prime(38183) == 0)
        goto error;

    if(is_prime(1234321237) == 0)
        goto error;

    if(is_prime(1234321232134323) == 1)
        goto error;

    if(is_prime(1234321232134387) == 0)
        goto error;

    if(is_prime(1234321287765432169) == 0)
        goto error;

    return 0;


    error:
        return 1;

}